

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O3

shared_ptr<boost::detail::tss_cleanup_function> * __thiscall
boost::shared_ptr<boost::detail::tss_cleanup_function>::operator=
          (shared_ptr<boost::detail::tss_cleanup_function> *this,
          shared_ptr<boost::detail::tss_cleanup_function> *r)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  tss_cleanup_function *__tmp;
  shared_count sStack_10;
  
  peVar1 = r->px;
  psVar2 = (r->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    psVar2->use_count_ = psVar2->use_count_ + 1;
    UNLOCK();
  }
  sStack_10.pi_ = (this->pn).pi_;
  this->px = peVar1;
  (this->pn).pi_ = psVar2;
  detail::shared_count::~shared_count(&sStack_10);
  return this;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_SP_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }